

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  pointer pUVar4;
  pointer pUVar5;
  ulong uVar6;
  long lVar7;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar8;
  
  if (0 < num) {
    uVar6 = (ulong)(uint)num;
    lVar7 = (long)start << 4;
    do {
      UnknownField::Delete
                ((UnknownField *)
                 ((long)&((this->fields_->
                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                          )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar7));
      lVar7 = lVar7 + 0x10;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  uVar6 = (ulong)(start + num);
  pvVar8 = this->fields_;
  pUVar5 = (pvVar8->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar4 = (pvVar8->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (uVar6 < (ulong)((long)pUVar4 - (long)pUVar5 >> 4)) {
    lVar7 = uVar6 << 4;
    do {
      puVar1 = (undefined8 *)((long)&pUVar5->number_ + lVar7);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pUVar5[-(long)num].number_ + lVar7);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar6 = uVar6 + 1;
      pvVar8 = this->fields_;
      pUVar5 = (pvVar8->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pUVar4 = (pvVar8->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < (ulong)((long)pUVar4 - (long)pUVar5 >> 4));
  }
  if (0 < num) {
    pUVar4 = pUVar4 + (-1 - (ulong)(num - 1));
    (pvVar8->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = pUVar4;
  }
  if (pUVar4 == pUVar5) {
    if (pUVar5 != (pointer)0x0) {
      operator_delete(pUVar5,(long)(pvVar8->
                                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                   )._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)pUVar5);
    }
    operator_delete(pvVar8,0x18);
    this->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
  if (fields_ && fields_->size() == 0) {
    // maintain invariant: never hold fields_ if empty.
    delete fields_;
    fields_ = NULL;
  }
}